

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recvstate.c
# Opt level: O0

int quicly_recvstate_update
              (quicly_recvstate_t *state,uint64_t off,size_t *len,int is_fin,size_t max_ranges)

{
  int iVar1;
  int in_ECX;
  long *in_RDX;
  ulong in_RSI;
  quicly_recvstate_t *in_RDI;
  uint64_t in_R8;
  size_t delta;
  int ret;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar1 = quicly_recvstate_transfer_complete(in_RDI);
  if (iVar1 != 0) {
    __assert_fail("!quicly_recvstate_transfer_complete(state)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/recvstate.c"
                  ,0x30,
                  "int quicly_recvstate_update(quicly_recvstate_t *, uint64_t, size_t *, int, size_t)"
                 );
  }
  if (in_RDI->eos == 0xffffffffffffffff) {
    if ((in_ECX != 0) &&
       (in_RDI->eos = in_RSI + *in_RDX,
       in_RDI->eos < (in_RDI->received).ranges[(in_RDI->received).num_ranges - 1].end)) {
      return 0x20006;
    }
  }
  else if (in_RDI->eos < in_RSI + *in_RDX) {
    return 0x20006;
  }
  if (in_RDI->data_off < in_RSI + *in_RDX) {
    if (in_RSI < in_RDI->data_off) {
      *in_RDX = *in_RDX - (in_RDI->data_off - in_RSI);
    }
    if (*in_RDX != 0) {
      iVar1 = quicly_ranges_add((quicly_ranges_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (iVar1 != 0) {
        return iVar1;
      }
      if (in_R8 < (in_RDI->received).num_ranges) {
        return 0xff07;
      }
    }
    if ((((in_RDI->received).num_ranges != 1) || (((in_RDI->received).ranges)->start != 0)) ||
       (((in_RDI->received).ranges)->end != in_RDI->eos)) {
      return 0;
    }
  }
  else {
    *in_RDX = 0;
    if (((in_RDI->received).ranges)->end != in_RDI->eos) {
      return 0;
    }
  }
  quicly_ranges_clear((quicly_ranges_t *)0x14b507);
  return 0;
}

Assistant:

int quicly_recvstate_update(quicly_recvstate_t *state, uint64_t off, size_t *len, int is_fin, size_t max_ranges)
{
    int ret;

    assert(!quicly_recvstate_transfer_complete(state));

    /* eos handling */
    if (state->eos == UINT64_MAX) {
        if (is_fin) {
            state->eos = off + *len;
            if (state->eos < state->received.ranges[state->received.num_ranges - 1].end)
                return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
        }
    } else {
        if (off + *len > state->eos)
            return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
    }

    /* no state change; entire data has already been received */
    if (off + *len <= state->data_off) {
        *len = 0;
        if (state->received.ranges[0].end == state->eos)
            goto Complete;
        return 0;
    }

    /* adjust if partially received */
    if (off < state->data_off) {
        size_t delta = state->data_off - off;
        off += delta;
        *len -= delta;
    }

    /* update received range */
    if (*len != 0) {
        if ((ret = quicly_ranges_add(&state->received, off, off + *len)) != 0)
            return ret;
        if (state->received.num_ranges > max_ranges)
            return QUICLY_ERROR_STATE_EXHAUSTION;
    }
    if (state->received.num_ranges == 1 && state->received.ranges[0].start == 0 && state->received.ranges[0].end == state->eos)
        goto Complete;

    return 0;

Complete:
    quicly_ranges_clear(&state->received);
    return 0;
}